

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O3

void __thiscall ConstantValue::saveXml(ConstantValue *this,ostream *s)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"<intb val=\"",0xb);
  *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) =
       *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar1 = std::ostream::_M_insert<long>((long)s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"/>\n",4);
  return;
}

Assistant:

void ConstantValue::saveXml(ostream &s) const

{
  s << "<intb val=\"" << dec << val << "\"/>\n";
}